

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O0

void __thiscall
SuiteFieldConvertorsTests::TestutcTimeStampConvertToMilli::RunImpl
          (TestutcTimeStampConvertToMilli *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int iVar4;
  TestDetails *details;
  TestDetails local_d8;
  string local_b8 [2];
  TestDetails local_78;
  string local_58;
  undefined1 local_28 [8];
  UtcTimeStamp input;
  TestutcTimeStampConvertToMilli *this_local;
  
  input.super_DateTime.m_time = (int64_t)this;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_28);
  FIX::DateTime::setHMS((DateTime *)local_28,0xc,5,6,0x22b,3);
  iVar4 = 0x1a;
  FIX::DateTime::setYMD((DateTime *)local_28,2000,4,0x1a);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (&local_58,(UtcTimeStampConvertor *)local_28,(UtcTimeStamp *)0x0,iVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0xfc);
  details = &local_78;
  UnitTest::CheckEqual<char[18],std::__cxx11::string>
            (pTVar1,(char (*) [18])"20000426-12:05:06",&local_58,details);
  iVar4 = (int)details;
  std::__cxx11::string::~string((string *)&local_58);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  FIX::UtcTimeStampConvertor::convert_abi_cxx11_
            (local_b8,(UtcTimeStampConvertor *)local_28,(UtcTimeStamp *)0x3,iVar4);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d8,*ppTVar3,0xfd);
  UnitTest::CheckEqual<char[22],std::__cxx11::string>
            (pTVar1,(char (*) [22])"20000426-12:05:06.555",local_b8,&local_d8);
  std::__cxx11::string::~string((string *)local_b8);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_28);
  return;
}

Assistant:

TEST(utcTimeStampConvertToMilli)
{
  UtcTimeStamp input;
  input.setHMS( 12, 5, 6, 555, 3 );
  input.setYMD( 2000, 4, 26 );
  CHECK_EQUAL( "20000426-12:05:06", UtcTimeStampConvertor::convert( input ) );
  CHECK_EQUAL( "20000426-12:05:06.555", UtcTimeStampConvertor::convert( input, 3 ) );
}